

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O3

UBool __thiscall icu_63::RuleBasedBreakIterator::BreakCache::seek(BreakCache *this,int32_t pos)

{
  ulong uVar1;
  int32_t *piVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = this->fStartBufIdx;
  uVar1 = (ulong)(int)uVar5;
  if (this->fBoundaries[uVar1] <= pos) {
    uVar4 = this->fEndBufIdx;
    uVar3 = (ulong)(int)uVar4;
    if (pos <= this->fBoundaries[uVar3]) {
      if (this->fBoundaries[uVar1] == pos) {
        piVar2 = this->fBoundaries + uVar1;
        this->fBufIdx = uVar5;
      }
      else if (this->fBoundaries[uVar3] == pos) {
        piVar2 = this->fBoundaries + uVar3;
        this->fBufIdx = uVar4;
      }
      else {
        if (uVar5 != uVar4) {
          do {
            uVar5 = (uint)uVar1;
            uVar4 = (int)((uint)((int)uVar3 < (int)uVar5) * 0x80 + (int)uVar3 + uVar5) / 2;
            uVar1 = (ulong)(uVar4 & 0x7f);
            if (this->fBoundaries[uVar1] <= pos) {
              uVar1 = uVar3 & 0xffffffff;
              uVar5 = uVar4 + 1 & 0x7f;
            }
            uVar3 = uVar1;
            uVar1 = (ulong)uVar5;
          } while (uVar5 != (uint)uVar3);
        }
        uVar5 = uVar5 - 1 & 0x7f;
        this->fBufIdx = uVar5;
        piVar2 = this->fBoundaries + uVar5;
      }
      this->fTextIdx = *piVar2;
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

UBool RuleBasedBreakIterator::BreakCache::seek(int32_t pos) {
    if (pos < fBoundaries[fStartBufIdx] || pos > fBoundaries[fEndBufIdx]) {
        return FALSE;
    }
    if (pos == fBoundaries[fStartBufIdx]) {
        // Common case: seek(0), from BreakIterator::first()
        fBufIdx = fStartBufIdx;
        fTextIdx = fBoundaries[fBufIdx];
        return TRUE;
    }
    if (pos == fBoundaries[fEndBufIdx]) {
        fBufIdx = fEndBufIdx;
        fTextIdx = fBoundaries[fBufIdx];
        return TRUE;
    }

    int32_t min = fStartBufIdx;
    int32_t max = fEndBufIdx;
    while (min != max) {
        int32_t probe = (min + max + (min>max ? CACHE_SIZE : 0)) / 2;
        probe = modChunkSize(probe);
        if (fBoundaries[probe] > pos) {
            max = probe;
        } else {
            min = modChunkSize(probe + 1);
        }
    }
    U_ASSERT(fBoundaries[max] > pos);
    fBufIdx = modChunkSize(max - 1);
    fTextIdx = fBoundaries[fBufIdx];
    U_ASSERT(fTextIdx <= pos);
    return TRUE;
}